

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O1

void __thiscall UKF::ProcessMeasurement(UKF *this,MeasurementPackage *meas_package)

{
  VectorXd *pVVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  DenseIndex DVar5;
  ulong uVar6;
  double *pdVar7;
  Index index;
  undefined8 *puVar8;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar9;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar10;
  double *pdVar11;
  ulong uVar12;
  ulong uVar13;
  char *__function;
  Index size;
  float fVar14;
  float fVar15;
  float fVar16;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_148;
  MeasurementPackage local_128;
  MeasurementPackage local_108;
  Scalar local_e8;
  Scalar local_e0;
  Scalar local_d8;
  Scalar local_d0;
  Scalar local_c8;
  Scalar local_c0;
  Scalar local_b8;
  Scalar local_b0;
  Scalar local_a8;
  Scalar local_a0;
  Scalar local_98;
  Scalar local_90;
  Scalar local_88;
  Scalar local_80;
  Scalar local_78;
  Scalar local_70;
  Scalar local_68;
  Scalar local_60;
  Scalar local_58;
  Scalar local_50;
  Scalar local_48;
  Scalar local_40;
  Scalar local_38;
  Scalar local_30;
  
  if (meas_package->sensor_type_ == LASER) {
    if (this->use_laser_ != true) {
      return;
    }
  }
  else {
    if (meas_package->sensor_type_ != RADAR) {
      return;
    }
    if (this->use_radar_ == false) {
      return;
    }
  }
  if (this->is_initialized_ != false) {
    lVar3 = meas_package->timestamp_;
    lVar4 = this->time_us_;
    this->time_us_ = lVar3;
    Prediction(this,(double)(float)((double)(lVar3 - lVar4) / 1000000.0));
    if (meas_package->sensor_type_ == RADAR) {
      local_128.sensor_type_ = meas_package->sensor_type_;
      local_128.timestamp_ = meas_package->timestamp_;
      DVar5 = (meas_package->raw_measurements_).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                ((DenseStorage<double,__1,__1,_1,_0> *)&local_128.raw_measurements_,DVar5,DVar5,1);
      uVar6 = (meas_package->raw_measurements_).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      if ((long)uVar6 < 0) goto LAB_00103f8b;
      if (local_128.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          .m_storage.m_rows != uVar6) {
        free(local_128.raw_measurements_.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
        if (uVar6 == 0) {
          local_128.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          .m_storage.m_data = (double *)0x0;
        }
        else if ((uVar6 >> 0x3d != 0) ||
                (local_128.raw_measurements_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
                      (double *)malloc(uVar6 * 8),
                local_128.raw_measurements_.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
                (double *)0x0)) {
          puVar8 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar8 = operator_delete;
          __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
      }
      local_128.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_rows = uVar6;
      if (uVar6 != (meas_package->raw_measurements_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
      goto LAB_00103faa;
      uVar12 = uVar6 & 0x7ffffffffffffffe;
      if (1 < (long)uVar6) {
        uVar13 = 0;
        do {
          pdVar11 = (meas_package->raw_measurements_).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                    + uVar13;
          dVar2 = pdVar11[1];
          local_128.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          .m_storage.m_data[uVar13] = *pdVar11;
          (local_128.raw_measurements_.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + uVar13)
          [1] = dVar2;
          uVar13 = uVar13 + 2;
        } while (uVar13 < uVar12);
      }
      if ((long)uVar12 < (long)uVar6) {
        pdVar11 = (meas_package->raw_measurements_).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        do {
          local_128.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          .m_storage.m_data[uVar12] = pdVar11[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar6 != uVar12);
      }
      UpdateRadar(this,&local_128);
      pdVar11 = local_128.raw_measurements_.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    }
    else {
      if (meas_package->sensor_type_ != LASER) {
        return;
      }
      local_108.sensor_type_ = meas_package->sensor_type_;
      local_108.timestamp_ = meas_package->timestamp_;
      DVar5 = (meas_package->raw_measurements_).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                ((DenseStorage<double,__1,__1,_1,_0> *)&local_108.raw_measurements_,DVar5,DVar5,1);
      uVar6 = (meas_package->raw_measurements_).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      if ((long)uVar6 < 0) {
LAB_00103f8b:
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/PlainObjectBase.h"
                      ,0xf1,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      if (local_108.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          .m_storage.m_rows != uVar6) {
        free(local_108.raw_measurements_.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
        if (uVar6 == 0) {
          local_108.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          .m_storage.m_data = (double *)0x0;
        }
        else if ((uVar6 >> 0x3d != 0) ||
                (local_108.raw_measurements_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
                      (double *)malloc(uVar6 * 8),
                local_108.raw_measurements_.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
                (double *)0x0)) {
          puVar8 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar8 = operator_delete;
          __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
      }
      local_108.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_rows = uVar6;
      if (uVar6 != (meas_package->raw_measurements_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
      {
LAB_00103faa:
        __assert_fail("rows() == other.rows() && cols() == other.cols()",
                      "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/Assign.h"
                      ,0x1f9,
                      "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      uVar12 = uVar6 & 0x7ffffffffffffffe;
      if (1 < (long)uVar6) {
        uVar13 = 0;
        do {
          pdVar11 = (meas_package->raw_measurements_).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                    + uVar13;
          dVar2 = pdVar11[1];
          local_108.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          .m_storage.m_data[uVar13] = *pdVar11;
          (local_108.raw_measurements_.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + uVar13)
          [1] = dVar2;
          uVar13 = uVar13 + 2;
        } while (uVar13 < uVar12);
      }
      if ((long)uVar12 < (long)uVar6) {
        pdVar11 = (meas_package->raw_measurements_).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        do {
          local_108.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          .m_storage.m_data[uVar12] = pdVar11[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar6 != uVar12);
      }
      UpdateLidar(this,&local_108);
      pdVar11 = local_108.raw_measurements_.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    }
    free(pdVar11);
    return;
  }
  pVVar1 = &this->x_;
  local_148.m_row = 0;
  local_148.m_col = 1;
  local_148.m_currentBlockRows = 1;
  *(this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = 1.0;
  local_d0 = 1.0;
  local_148.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)pVVar1;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_148,
                      &local_d0);
  local_d8 = 1.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar9,&local_d8);
  local_e0 = 1.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar9,&local_e0);
  local_e8 = 0.1;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar9,&local_e8);
  if ((local_148.m_currentBlockRows + local_148.m_row !=
       ((local_148.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
       m_storage.m_rows) || (local_148.m_col != 1)) {
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
    ;
LAB_00103f81:
    __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/CommaInitializer.h"
                  ,0x6f,__function);
  }
  local_148.m_xpr = &this->P_;
  local_148.m_row = 0;
  local_148.m_col = 1;
  local_148.m_currentBlockRows = 1;
  *(this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       0.15;
  local_d0 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (&local_148,&local_d0);
  local_d8 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_d8);
  local_e0 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_e0);
  local_e8 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_e8);
  local_30 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_30);
  local_38 = 0.15;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_38);
  local_40 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_40);
  local_48 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_48);
  local_50 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_50);
  local_58 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_58);
  local_60 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_60);
  local_68 = 1.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_68);
  local_70 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_70);
  local_78 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_78);
  local_80 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_80);
  local_88 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_88);
  local_90 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_90);
  local_98 = 1.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_98);
  local_a0 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_a0);
  local_a8 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_a8);
  local_b0 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_b0);
  local_b8 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_b8);
  local_c0 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_c0);
  local_c8 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar10,&local_c8);
  if (((local_148.m_currentBlockRows + local_148.m_row !=
        ((local_148.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
        m_storage.m_rows) &&
      (((local_148.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
       m_storage.m_cols != 0)) ||
     (local_148.m_col !=
      ((local_148.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
      m_storage.m_cols)) {
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
    ;
    goto LAB_00103f81;
  }
  this->time_us_ = meas_package->timestamp_;
  if (meas_package->sensor_type_ == RADAR) {
    if (this->use_radar_ != true) goto LAB_00103e27;
    lVar3 = (meas_package->raw_measurements_).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    if (((lVar3 < 1) || (lVar3 == 1)) || (lVar3 < 3)) goto LAB_00103f36;
    pdVar11 = (meas_package->raw_measurements_).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    fVar14 = (float)*pdVar11;
    fVar15 = (float)pdVar11[1];
    fVar16 = cosf(fVar15);
    if ((this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
        1) goto LAB_00103f36;
    *(this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double)(fVar16 * fVar14);
    fVar15 = sinf(fVar15);
    if ((this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
        2) goto LAB_00103f36;
    dVar2 = (double)(fVar15 * fVar14);
    pdVar11 = (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
  }
  else {
    if ((meas_package->sensor_type_ != LASER) || (this->use_laser_ != true)) goto LAB_00103e27;
    lVar3 = (meas_package->raw_measurements_).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    if ((lVar3 < 1) ||
       (lVar4 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows, lVar4 < 1)) {
LAB_00103f36:
      __assert_fail("index >= 0 && index < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/DenseCoeffsBase.h"
                    ,0x18a,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
    pdVar7 = (meas_package->raw_measurements_).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    pdVar11 = (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    *pdVar11 = *pdVar7;
    if ((lVar3 == 1) || (lVar4 == 1)) goto LAB_00103f36;
    dVar2 = pdVar7[1];
  }
  pdVar11[1] = dVar2;
LAB_00103e27:
  this->is_initialized_ = true;
  return;
}

Assistant:

void UKF::ProcessMeasurement(MeasurementPackage meas_package) {
  /**
  TODO:
  Complete this function! Make sure you switch between lidar and radar
  measurements.
  */
  
  // skip predict/update if sensor type is ignored
  if ((meas_package.sensor_type_ == MeasurementPackage::RADAR && use_radar_) ||
      (meas_package.sensor_type_ == MeasurementPackage::LASER && use_laser_)) {
    
    /*****************************************************************************
    *  Initialization
    ****************************************************************************/
    if (!is_initialized_) {
      /**
      TODO:
      * Initialize the state x_ with the first measurement.
      * Create the covariance matrix.
      * Remember: you'll need to convert radar from polar to cartesian coordinates.
      */
      /**
      Initialize state.
      */

      // first measurement
      x_ << 1, 1, 1, 1, 0.1;

      // init covariance matrix
      P_ << 0.15,    0, 0, 0, 0,
               0, 0.15, 0, 0, 0,
               0,    0, 1, 0, 0,
               0,    0, 0, 1, 0,
               0,    0, 0, 0, 1;

      // init timestamp
      time_us_ = meas_package.timestamp_;

      if (meas_package.sensor_type_ == MeasurementPackage::LASER && use_laser_) {

        x_(0) = meas_package.raw_measurements_(0);
        x_(1) = meas_package.raw_measurements_(1);

      }
      else if (meas_package.sensor_type_ == MeasurementPackage::RADAR && use_radar_) {
        /**
        Convert radar from polar to cartesian coordinates and initialize state.
        */
        float ro = meas_package.raw_measurements_(0);
        float phi = meas_package.raw_measurements_(1);
        float ro_dot = meas_package.raw_measurements_(2);
        x_(0) = ro     * cos(phi);
        x_(1) = ro     * sin(phi);
      }

      // done initializing, no need to predict or update
      is_initialized_ = true;

      return;
    }

    /*****************************************************************************
    *  Prediction
    ****************************************************************************/
    //compute the time elapsed between the current and previous measurements
    float dt = (meas_package.timestamp_ - time_us_) / 1000000.0;	//dt - expressed in seconds
    time_us_ = meas_package.timestamp_;

    Prediction(dt);

    /*****************************************************************************
    *  Update
    ****************************************************************************/

    if (meas_package.sensor_type_ == MeasurementPackage::LASER) {
      UpdateLidar(meas_package);
    }
    else if (meas_package.sensor_type_ == MeasurementPackage::RADAR) {
      UpdateRadar(meas_package);
    }
  }
}